

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-string.h
# Opt level: O0

String * __thiscall testing::internal::String::operator=(String *this,String *rhs)

{
  char *pcVar1;
  char *buffer;
  String *rhs_local;
  String *this_local;
  
  if (this != rhs) {
    buffer = this->c_str_;
    if (buffer != (char *)0x0) {
      operator_delete__(buffer);
    }
    pcVar1 = c_str(rhs);
    if (pcVar1 == (char *)0x0) {
      this->c_str_ = (char *)0x0;
      this->length_ = 0;
    }
    else {
      pcVar1 = c_str(rhs);
      length(rhs);
      ConstructNonNull(this,buffer,(size_t)pcVar1);
    }
  }
  return this;
}

Assistant:

const String& operator=(const String& rhs) {
    if (this != &rhs) {
      delete[] c_str_;
      if (rhs.c_str() == NULL) {
        c_str_ = NULL;
        length_ = 0;
      } else {
        ConstructNonNull(rhs.c_str(), rhs.length());
      }
    }

    return *this;
  }